

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLScanner.cpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLScanner::scanMiscellaneous(XMLScanner *this)

{
  ReaderMgr *this_00;
  XMLDocumentHandler *pXVar1;
  bool bVar2;
  XMLCh XVar3;
  Codes toEmit;
  XMLBufBid bbCData;
  
  bbCData.fBuffer = XMLBufferMgr::bidOnBuffer(&this->fBufMgr);
  this_00 = &this->fReaderMgr;
  bbCData.fMgr = &this->fBufMgr;
  do {
    while( true ) {
      XVar3 = ReaderMgr::peekNextChar(this_00);
      if (XVar3 == L'<') break;
      if (XVar3 == L'\0') {
        XMLBufBid::~XMLBufBid(&bbCData);
        return;
      }
      toEmit = ExpectedCommentOrPI;
      if ((char)((this->fReaderMgr).fCurReader)->fgCharCharsTable[(ushort)XVar3] < '\0') {
        if (this->fDocHandler == (XMLDocumentHandler *)0x0) {
          ReaderMgr::skipPastSpaces(this_00);
        }
        else {
          ReaderMgr::getSpaces(this_00,bbCData.fBuffer);
          pXVar1 = this->fDocHandler;
          (bbCData.fBuffer)->fBuffer[(bbCData.fBuffer)->fIndex] = L'\0';
          (*pXVar1->_vptr_XMLDocumentHandler[8])();
        }
      }
      else {
LAB_002c1a9c:
        emitError(this,toEmit);
        ReaderMgr::skipPastChar(this_00,L'>');
      }
    }
    bVar2 = checkXMLDecl(this,true);
    toEmit = NotValidAfterContent;
    if (bVar2) goto LAB_002c1a9c;
    bVar2 = ReaderMgr::skippedString(this_00,L"<?");
    if (bVar2) {
      scanPI(this);
    }
    else {
      bVar2 = ReaderMgr::skippedString(this_00,(XMLCh *)XMLUni::fgCommentString);
      toEmit = ExpectedCommentOrPI;
      if (!bVar2) goto LAB_002c1a9c;
      scanComment(this);
    }
  } while( true );
}

Assistant:

void XMLScanner::scanMiscellaneous()
{
    // Get a buffer for this work
    XMLBufBid bbCData(&fBufMgr);

    while (true)
    {
        try
        {
            const XMLCh nextCh = fReaderMgr.peekNextChar();

            // Watch for end of file and break out
            if (!nextCh)
                break;

            if (nextCh == chOpenAngle)
            {
                if (checkXMLDecl(true))
                {
                    // Can't have an XML decl here
                    emitError(XMLErrs::NotValidAfterContent);
                    fReaderMgr.skipPastChar(chCloseAngle);
                }
                else if (fReaderMgr.skippedString(XMLUni::fgPIString))
                {
                    scanPI();
                }
                 else if (fReaderMgr.skippedString(XMLUni::fgCommentString))
                {
                    scanComment();
                }
                else
                {
                    // This can't be possible, so just give up
                    emitError(XMLErrs::ExpectedCommentOrPI);
                    fReaderMgr.skipPastChar(chCloseAngle);
                }
            }
            else if (fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
            {
                //  If we have a doc handler, then gather up the spaces and
                //  call back. Otherwise, just skip over whitespace.
                if (fDocHandler)
                {
                    fReaderMgr.getSpaces(bbCData.getBuffer());
                    fDocHandler->ignorableWhitespace
                    (
                        bbCData.getRawBuffer()
                        , bbCData.getLen()
                        , false
                    );
                }
                else
                {
                    fReaderMgr.skipPastSpaces();
                }
            }
            else
            {
                emitError(XMLErrs::ExpectedCommentOrPI);
                fReaderMgr.skipPastChar(chCloseAngle);
            }
        }
        catch(const EndOfEntityException&)
        {
            //  Some entity leaked out of the content part of the document. Issue
            //  a warning and keep going.
            emitError(XMLErrs::EntityPropogated);
        }
    }
}